

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O1

void __thiscall front::symbol::VoidSymbol::VoidSymbol(VoidSymbol *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"void","");
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR___cxa_pure_virtual_001efa58;
  (this->super_Symbol)._name._M_dataplus._M_p = (pointer)&(this->super_Symbol)._name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Symbol)._name,local_38,local_30 + (long)local_38);
  (this->super_Symbol)._layerNum = -1;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001efa08;
  return;
}

Assistant:

VoidSymbol() : Symbol("void", -1) {}